

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.h
# Opt level: O0

void __thiscall
cmListFileContext::cmListFileContext(cmListFileContext *this,cmListFileContext *param_1)

{
  cmListFileContext *param_1_local;
  cmListFileContext *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)param_1);
  std::__cxx11::string::string((string *)&this->FilePath,(string *)&param_1->FilePath);
  this->Line = param_1->Line;
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional(&this->DeferId,&param_1->DeferId);
  return;
}

Assistant:

cmListFileContext(const cmListFileContext& /*other*/) = default;